

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O2

Instr * __thiscall LowererMDArch::LowerExitInstr(LowererMDArch *this,ExitInstr *exitInstr)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  RegNum reg_00;
  BOOL BVar5;
  Which WVar6;
  RegOpnd *pRVar7;
  RegOpnd *pRVar8;
  IndirOpnd *src1Opnd;
  Instr *pIVar9;
  IntConstOpnd *pIVar10;
  Instr *pIVar11;
  JITTimeFunctionBody *pJVar12;
  AsmJsJITInfo *this_00;
  Func *pFVar13;
  IRType IVar14;
  RegNum reg;
  long lVar15;
  int iVar16;
  int32 offset;
  undefined4 *local_38;
  
  pIVar11 = (exitInstr->super_Instr).m_prev;
  if (pIVar11 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_38 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x80a,"(exitPrevInstr)",
                       "Can a function have only 1 instr ? Or is the instr chain broken");
    if (!bVar3) goto LAB_005cf491;
    *local_38 = 0;
  }
  else {
    local_38 = (undefined4 *)__tls_get_addr();
  }
  offset = 0;
  pRVar7 = IR::RegOpnd::New((StackSym *)0x0,RegRSP,TyInt64,this->m_func);
  iVar16 = 0;
  for (lVar15 = 1; lVar15 != 0x21; lVar15 = lVar15 + 1) {
    bVar3 = LinearScan::IsCalleeSaved((RegNum)lVar15);
    if ((bVar3) &&
       ((BVar5 = Func::HasTry(this->m_func), BVar5 != 0 ||
        (BVar4 = BVUnitT<unsigned_long>::Test(&this->m_func->m_regsUsed,(BVIndex)lVar15),
        BVar4 != '\0')))) {
      IVar14 = RegTypes[lVar15];
      pRVar8 = IR::RegOpnd::New((StackSym *)0x0,(RegNum)lVar15,IVar14,this->m_func);
      if (IVar14 != TyInt64) {
        if (IVar14 == TyFloat64) {
          src1Opnd = IR::IndirOpnd::New(pRVar7,offset,TyFloat64,this->m_func,false);
          pIVar9 = IR::Instr::New(MOVAPS,&pRVar8->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
          offset = offset + 0x10;
          IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar9);
          goto LAB_005cf1db;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_38 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0x825,"(type == TyInt64)","type == TyInt64");
        if (!bVar3) goto LAB_005cf491;
        *local_38 = 0;
      }
      pIVar9 = IR::Instr::New(POP,&pRVar8->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar9);
      iVar16 = iVar16 + 8;
    }
LAB_005cf1db:
  }
  pFVar13 = this->m_func;
  if (iVar16 != pFVar13->m_savedRegSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_38 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x82f,"(savedRegSize == (uint)this->m_func->GetSavedRegSize())",
                       "savedRegSize == (uint)this->m_func->GetSavedRegSize()");
    if (!bVar3) goto LAB_005cf491;
    *local_38 = 0;
    pFVar13 = this->m_func;
  }
  uVar1 = pFVar13->m_argsSize;
  if ((ulong)uVar1 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_38 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x834,"(stackArgsSize)","stackArgsSize");
    if (!bVar3) goto LAB_005cf491;
    *local_38 = 0;
    pFVar13 = this->m_func;
  }
  if (iVar16 != 0 || offset != 0) {
    pIVar10 = IR::IntConstOpnd::New((ulong)uVar1,TyInt64,pFVar13,false);
    pIVar9 = IR::Instr::New(ADD,&pRVar7->super_Opnd,&pRVar7->super_Opnd,&pIVar10->super_Opnd,
                            this->m_func);
    IR::Instr::InsertAfter(pIVar11,pIVar9);
    pFVar13 = this->m_func;
  }
  pRVar7 = IR::RegOpnd::New((StackSym *)0x0,RegRSP,TyInt64,pFVar13);
  pRVar8 = IR::RegOpnd::New((StackSym *)0x0,RegRBP,TyInt64,this->m_func);
  pIVar11 = IR::Instr::New(MOV,&pRVar7->super_Opnd,&pRVar8->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar11);
  pIVar11 = IR::Instr::New(POP,&pRVar8->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar11);
  pIVar10 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  pJVar12 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsAsmJsMode(pJVar12);
  if ((!bVar3) || (bVar3 = Func::IsLoopBody(this->m_func), bVar3)) {
switchD_005cf3f1_caseD_1:
    IVar14 = TyInt64;
    reg_00 = GetRegReturn(TyInt64);
    goto LAB_005cf35f;
  }
  pJVar12 = Func::GetJITFunctionBody(this->m_func);
  this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar12);
  WVar6 = AsmJsJITInfo::GetRetType(this_00);
  switch(WVar6) {
  case Int64:
  case Signed:
    goto switchD_005cf3f1_caseD_1;
  case Double:
  case Float:
    IVar14 = TyFloat64;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_38 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x886,"((0))","(0)");
    if (!bVar3) {
LAB_005cf491:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *local_38 = 0;
  case Void:
    pRVar7 = (RegOpnd *)0x0;
    goto LAB_005cf371;
  case Int32x4:
    IVar14 = TySimd128I4;
    break;
  case Uint32x4:
    IVar14 = TySimd128U4;
    break;
  case Int16x8:
    IVar14 = TySimd128I8;
    break;
  case Int8x16:
    reg_00 = GetRegReturnAsmJs(TySimd128I16);
    pFVar13 = this->m_func;
    IVar14 = TySimd128U16;
    goto LAB_005cf369;
  case Uint16x8:
    IVar14 = TySimd128U8;
    break;
  case Uint8x16:
    IVar14 = TySimd128U16;
    break;
  case Bool32x4:
    IVar14 = TySimd128B4;
    break;
  case Bool16x8:
    IVar14 = TySimd128B8;
    break;
  case Bool8x16:
    IVar14 = TySimd128B16;
    break;
  case Float32x4:
    IVar14 = TySimd128F4;
    break;
  case Float64x2:
    IVar14 = TySimd128D2;
    break;
  case Int64x2:
    IVar14 = TySimd128I2;
  }
  reg_00 = GetRegReturnAsmJs(IVar14);
LAB_005cf35f:
  pFVar13 = this->m_func;
LAB_005cf369:
  pRVar7 = IR::RegOpnd::New((StackSym *)0x0,reg_00,IVar14,pFVar13);
LAB_005cf371:
  pIVar11 = IR::Instr::New(RET,this->m_func);
  IR::Instr::SetSrc1(pIVar11,&pIVar10->super_Opnd);
  if (pRVar7 != (RegOpnd *)0x0) {
    IR::Instr::SetSrc2(pIVar11,&pRVar7->super_Opnd);
  }
  IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar11);
  pIVar11->m_opcode = RET;
  return &exitInstr->super_Instr;
}

Assistant:

IR::Instr *
LowererMDArch::LowerExitInstr(IR::ExitInstr * exitInstr)
{
    uint32 savedRegSize = 0;

    // POP used callee-saved registers

    IR::Instr * exitPrevInstr = exitInstr->m_prev;
    AssertMsg(exitPrevInstr, "Can a function have only 1 instr ? Or is the instr chain broken");

    IR::RegOpnd *stackPointer = IR::RegOpnd::New(nullptr, GetRegStackPointer(), TyMachReg, this->m_func);

    unsigned xmmOffset = 0;

    for (RegNum reg = (RegNum)(RegNOREG + 1); reg < RegNumCount; reg = (RegNum)(reg+1))
    {
        if (LinearScan::IsCalleeSaved(reg) && (this->m_func->HasTry() || this->m_func->m_regsUsed.Test(reg)))
        {
            IRType       type    = RegTypes[reg];
            IR::RegOpnd *regOpnd = IR::RegOpnd::New(nullptr, reg, type, this->m_func);

            if (type == TyFloat64)
            {
                IR::Instr *restoreInstr = IR::Instr::New(Js::OpCode::MOVAPS,
                                                         regOpnd,
                                                         IR::IndirOpnd::New(stackPointer,
                                                                            xmmOffset,
                                                                            type,
                                                                            this->m_func),
                                                         this->m_func);
                xmmOffset += (MachDouble * 2);
                exitInstr->InsertBefore(restoreInstr);
            }
            else
            {
                Assert(type == TyInt64);

                IR::Instr *popInstr = IR::Instr::New(Js::OpCode::POP, regOpnd, this->m_func);
                exitInstr->InsertBefore(popInstr);

                savedRegSize += MachPtr;
            }
        }
    }

    Assert(savedRegSize == (uint)this->m_func->GetSavedRegSize());


    // Generate ADD RSP, argsStackSize before the register restore (if there are any)
    uint32 stackArgsSize = this->m_func->GetArgsSize();
    Assert(stackArgsSize);
    if (savedRegSize || xmmOffset)
    {
        IR::IntConstOpnd *stackSizeOpnd = IR::IntConstOpnd::New(stackArgsSize, TyMachReg, this->m_func);
        IR::Instr *addInstr = IR::Instr::New(Js::OpCode::ADD, stackPointer, stackPointer, stackSizeOpnd, this->m_func);
        exitPrevInstr->InsertAfter(addInstr);
    }

    //
    // useful register operands
    //
    IR::RegOpnd * rspOpnd = IR::RegOpnd::New(nullptr, RegRSP, TyMachReg, this->m_func);
    IR::RegOpnd * rbpOpnd = IR::RegOpnd::New(nullptr, RegRBP, TyMachReg, this->m_func);

    // Restore frame

    // Generate MOV RSP, RBP

    IR::Instr * movInstr = IR::Instr::New(Js::OpCode::MOV, rspOpnd, rbpOpnd, this->m_func);
    exitInstr->InsertBefore(movInstr);

    // Generate POP RBP

    IR::Instr * pushInstr = IR::Instr::New(Js::OpCode::POP, rbpOpnd, this->m_func);
    exitInstr->InsertBefore(pushInstr);

    // Insert RET
    IR::IntConstOpnd * intSrc = IR::IntConstOpnd::New(0, TyInt32, this->m_func);
    IR::RegOpnd *retReg = nullptr;
    if (m_func->GetJITFunctionBody()->IsAsmJsMode() && !m_func->IsLoopBody())
    {
        switch (m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetRetType())
        {
        case Js::AsmJsRetType::Double:
        case Js::AsmJsRetType::Float:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TyMachDouble), TyMachDouble, this->m_func);
            break;
#ifdef ENABLE_WASM_SIMD
        case Js::AsmJsRetType::Int32x4:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128I4), TySimd128I4, this->m_func);
            break;
        case Js::AsmJsRetType::Int16x8:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128I8), TySimd128I8, this->m_func);
            break;
        case Js::AsmJsRetType::Int8x16:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128I16), TySimd128U16, this->m_func);
            break;
        case Js::AsmJsRetType::Uint32x4:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128U4), TySimd128U4, this->m_func);
            break;
        case Js::AsmJsRetType::Uint16x8:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128U8), TySimd128U8, this->m_func);
            break;
        case Js::AsmJsRetType::Uint8x16:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128U16), TySimd128U16, this->m_func);
            break;
        case Js::AsmJsRetType::Bool32x4:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128B4), TySimd128B4, this->m_func);
            break;
        case Js::AsmJsRetType::Bool16x8:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128B8), TySimd128B8, this->m_func);
            break;
        case Js::AsmJsRetType::Bool8x16:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128B16), TySimd128B16, this->m_func);
            break;
        case Js::AsmJsRetType::Float32x4:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128F4), TySimd128F4, this->m_func);
            break;
        case Js::AsmJsRetType::Float64x2:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128D2), TySimd128D2, this->m_func);
            break;
        case Js::AsmJsRetType::Int64x2:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128I2), TySimd128I2, this->m_func);
            break;
#endif
        case Js::AsmJsRetType::Int64:
        case Js::AsmJsRetType::Signed:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturn(TyMachReg), TyMachReg, this->m_func);
            break;
        case Js::AsmJsRetType::Void:
            break;
        default:
            Assume(UNREACHED);
        }
    }
    else
    {
        retReg = IR::RegOpnd::New(nullptr, this->GetRegReturn(TyMachReg), TyMachReg, this->m_func);
    }


    // Generate RET
    IR::Instr * retInstr = IR::Instr::New(Js::OpCode::RET, this->m_func);
    retInstr->SetSrc1(intSrc);
    if (retReg)
    {
        retInstr->SetSrc2(retReg);
    }
    exitInstr->InsertBefore(retInstr);

    retInstr->m_opcode = Js::OpCode::RET;


    return exitInstr;
}